

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA.cpp
# Opt level: O1

void InitializeOutput(Arguments *args,DecPOMDPDiscreteInterface *decpomdp,QFunctionJAOHInterface *q,
                     bool GMAAusesBGIPSolver,string *filename,string *timingsFilename,
                     string *jpolFilename,ofstream *of,ofstream *of_jpol)

{
  __nlink_t *p_Var1;
  pointer pcVar2;
  int iVar3;
  ostream *poVar4;
  int *piVar5;
  undefined8 *puVar6;
  char *pcVar7;
  stringstream ss;
  stat local_2b0;
  long *local_220 [2];
  long local_210 [2];
  string *local_200;
  long *local_1f8;
  long local_1f0;
  long local_1e8 [2];
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  long *local_1b8 [2];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  if (args->dryrun == 0) {
    local_200 = timingsFilename;
    local_1b8[0] = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"GMAA","");
    directories::MADPCreateResultsDir
              ((string *)local_1b8,
               (MultiAgentDecisionProcessInterface *)
               (decpomdp + *(long *)(*(long *)decpomdp + -0x40)));
    if (local_1b8[0] != local_1a8) {
      operator_delete(local_1b8[0],local_1a8[0] + 1);
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    local_220[0] = local_210;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"GMAA","");
    directories::MADPGetResultsFilename
              ((string *)&local_2b0,(MultiAgentDecisionProcessInterface *)local_220,
               (Arguments *)(decpomdp + *(long *)(*(long *)decpomdp + -0x40)));
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_2b0.st_dev,local_2b0.st_ino);
    GMAAtype::SoftPrint_abi_cxx11_((GMAA_t)&local_1d8);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_1d8,local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_",1);
    (**(code **)(*(long *)(q + *(long *)(*(long *)q + -0x60)) + 0x48))
              (&local_1f8,q + *(long *)(*(long *)q + -0x60));
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_1f8,local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_h",2);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,args->horizon);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_restarts",9);
    std::ostream::operator<<(poVar4,args->nrRestarts);
    if (local_1f8 != local_1e8) {
      operator_delete(local_1f8,local_1e8[0] + 1);
    }
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    p_Var1 = &local_2b0.st_nlink;
    if ((__nlink_t *)local_2b0.st_dev != p_Var1) {
      operator_delete((void *)local_2b0.st_dev,local_2b0.st_nlink + 1);
    }
    if (local_220[0] != local_210) {
      operator_delete(local_220[0],local_210[0] + 1);
    }
    if (args->useBGclustering != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_Cluster",8);
      BayesianGameWithClusterInfo::SoftPrint_abi_cxx11_((BGClusterAlgorithm)&local_2b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_2b0.st_dev,local_2b0.st_ino);
      if ((__nlink_t *)local_2b0.st_dev != p_Var1) {
        operator_delete((void *)local_2b0.st_dev,local_2b0.st_nlink + 1);
      }
      if (args->BGClusterAlgorithm != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_tJB",4);
        poVar4 = std::ostream::_M_insert<double>(args->thresholdJB);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_tPjaoh",7);
        std::ostream::_M_insert<double>(args->thresholdPjaoh);
      }
    }
    if (args->gmaa == kGMAA) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_k",2);
      std::ostream::operator<<((ostream *)local_1a8,args->k);
    }
    pcVar7 = "_NoCache";
    if (args->cache_flat_models != false) {
      pcVar7 = "_CacheFM";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,8);
    if (GMAAusesBGIPSolver) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_",1);
      BGIP_SolverType::SoftPrint_abi_cxx11_((BGIP_Solver_t)&local_2b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_2b0.st_dev,local_2b0.st_ino);
      if ((__nlink_t *)local_2b0.st_dev != p_Var1) {
        operator_delete((void *)local_2b0.st_dev,local_2b0.st_nlink + 1);
      }
      switch(args->bgsolver) {
      case AM:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_AM_restarts",0xc);
        std::ostream::operator<<((ostream *)local_1a8,args->nrAMRestarts);
        break;
      case CE:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_CEr",4);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_i",2);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_s",2);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_sfu",4);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_a",2);
        poVar4 = std::ostream::_M_insert<double>(args->CE_alpha);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_ht",3);
        std::ostream::_M_insert<bool>(SUB81(poVar4,0));
        break;
      case BnB:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_ka",3);
        poVar4 = std::ostream::_M_insert<bool>(SUB81((ostream *)local_1a8,0));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_JTO",4);
        BGIP_BnB::SoftPrint_abi_cxx11_((BnB_JointTypeOrdering)&local_2b0);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)local_2b0.st_dev,local_2b0.st_ino);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_CCI",4);
        std::ostream::_M_insert<bool>(SUB81(poVar4,0));
        if ((__nlink_t *)local_2b0.st_dev != p_Var1) {
          operator_delete((void *)local_2b0.st_dev,local_2b0.st_nlink + 1);
        }
        break;
      case Random:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_Random",7);
      }
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)filename,(string *)&local_2b0);
    if ((__nlink_t *)local_2b0.st_dev != p_Var1) {
      operator_delete((void *)local_2b0.st_dev,local_2b0.st_nlink + 1);
    }
    if (args->noReCompute != 0) {
      iVar3 = stat((filename->_M_dataplus)._M_p,&local_2b0);
      if ((iVar3 == -1) && (piVar5 = __errno_location(), *piVar5 != 2)) {
        InitializeOutput();
        goto LAB_0011512e;
      }
      if ((iVar3 != -1) && ((local_2b0.st_mode & 0xf000) != 0x8000 || local_2b0.st_size != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Results file ",0xd);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(filename->_M_dataplus)._M_p,
                            filename->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4," already exists, not recomputing it.",0x24);
        std::endl<char,std::char_traits<char>>(poVar4);
        exit(0);
      }
    }
    if (args->dryrun == 0) {
      std::ofstream::open((char *)of,(_Ios_Openmode)(filename->_M_dataplus)._M_p);
      if (((byte)of[*(long *)(*(long *)of + -0x18) + 0x20] & 5) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"GMAA: could not open ",0x15);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(filename->_M_dataplus)._M_p,
                            filename->_M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Results will not be stored to disk.",0x23);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
        std::ostream::put(' ');
        std::ostream::flush();
        args->dryrun = 1;
      }
      pcVar2 = (filename->_M_dataplus)._M_p;
      local_2b0.st_dev = (__dev_t)p_Var1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b0,pcVar2,pcVar2 + filename->_M_string_length);
      std::__cxx11::string::append((char *)&local_2b0);
      std::__cxx11::string::operator=((string *)local_200,(string *)&local_2b0);
      if ((__nlink_t *)local_2b0.st_dev != p_Var1) {
        operator_delete((void *)local_2b0.st_dev,local_2b0.st_nlink + 1);
      }
      pcVar2 = (filename->_M_dataplus)._M_p;
      local_2b0.st_dev = (__dev_t)p_Var1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b0,pcVar2,pcVar2 + filename->_M_string_length);
      std::__cxx11::string::append((char *)&local_2b0);
      std::__cxx11::string::operator=((string *)jpolFilename,(string *)&local_2b0);
      if ((__nlink_t *)local_2b0.st_dev != p_Var1) {
        operator_delete((void *)local_2b0.st_dev,local_2b0.st_nlink + 1);
      }
      if ((args->dryrun == 0) &&
         (std::ofstream::open((char *)of_jpol,(_Ios_Openmode)(jpolFilename->_M_dataplus)._M_p),
         ((byte)of_jpol[*(long *)(*(long *)of_jpol + -0x18) + 0x20] & 5) != 0)) {
LAB_0011512e:
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = "Could not open jpol file";
        __cxa_throw(puVar6,&char_const*::typeinfo,0);
      }
      if (-1 < args->verbose) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Computing ",10);
        std::__cxx11::stringbuf::str();
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_2b0.st_dev,local_2b0.st_ino);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        if ((__nlink_t *)local_2b0.st_dev != p_Var1) {
          operator_delete((void *)local_2b0.st_dev,local_2b0.st_nlink + 1);
        }
      }
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

void InitializeOutput(ArgumentHandlers::Arguments &args,
                      DecPOMDPDiscreteInterface* decpomdp,
                      QFunctionJAOHInterface *q,
                      bool GMAAusesBGIPSolver,
                      string &filename,
                      string &timingsFilename,
                      string &jpolFilename,
                      ofstream &of,
                      ofstream &of_jpol)
{
    if(!args.dryrun)
    {
        // Create results dir if it doesn't exist already
        try {
        directories::MADPCreateResultsDir("GMAA",*decpomdp);
        } catch(E& e)
        {
            e.Print();
            cout << "Results will not be stored to disk." << endl;
            args.dryrun=true;
        }

        stringstream ss;
        ss  << directories::MADPGetResultsFilename("GMAA",*decpomdp,args)
            << SoftPrint(args.gmaa)
            << "_" << q->SoftPrintBrief() << "_h" << args.horizon
            << "_restarts"<< args.nrRestarts;

        //check the method specific arguments 
        //and add them to file name
        if(args.useBGclustering)
        {
            ss << "_Cluster";
            ss  << BayesianGameWithClusterInfo::SoftPrint(
                        static_cast<BayesianGameWithClusterInfo::BGClusterAlgorithm>(args.BGClusterAlgorithm)
                    );
            if(args.BGClusterAlgorithm != BayesianGameWithClusterInfo::Lossless)
                ss << "_tJB" << args.thresholdJB << "_tPjaoh" << args.thresholdPjaoh;
        }
        switch(args.gmaa)
        {
        case MAAstar:
        case MAAstarClassic:
        case FSPC:
            break;
        case kGMAA: 
            ss << "_k" << args.k;
            break;
        }
        if(args.cache_flat_models)
            ss << "_CacheFM";
        else
            ss << "_NoCache";
        if(GMAAusesBGIPSolver)
        {
            ss << "_" << SoftPrint(args.bgsolver);
            // if not, we don't want to add these parameters to the
            // filename as they will not be used
            switch(args.bgsolver)
            {
            case BFS:
            case BFSNonInc:
                // BFS has no parameters
                break;
            case AM:
                ss << "_AM_restarts"<< args.nrAMRestarts;
                break;
            case CE:
                ss  << "_CEr" << args.nrCERestarts 
                    << "_i" << args.nrCEIterations
                    << "_s" << args.nrCESamples 
                    << "_sfu" << args.nrCESamplesForUpdate
                    << "_a" << args.CE_alpha 
                    << "_ht" << args.CE_use_hard_threshold;
                break;
            case MaxPlus:
                break;
            case BnB:
                ss << "_ka" << args.BnB_keepAll
                   << "_JTO" << SoftPrint(args.BnBJointTypeOrdering)
                   << "_CCI" << args.BnB_consistentCompleteInformationHeur;
                break;
            case CGBG_MaxPlus:
                break;
            case NDP:
                break;    
            case Random:
                ss << "_Random";
                break;
            }
        }

        filename=ss.str();

        if(args.noReCompute)
        {
            struct stat sb;
            bool fileExists=true;

            if (stat(filename.c_str(), &sb) == -1) {
                if(errno==ENOENT)
                    fileExists=false;
                else
                {
                    perror("stat");
                    exit(EXIT_SUCCESS);
                }
            }
            
            if(S_ISREG(sb.st_mode) &&
               sb.st_size==0)
                fileExists=false;
            
            if(fileExists)
            {
                cout << "Results file " << filename
                     << " already exists, not recomputing it." << endl;
                exit(0);
            }
        }

        if(!args.dryrun)
        {
            of.open(filename.c_str());
            if(!of)
            {
                cout << "GMAA: could not open " << filename << endl;
                cout << "Results will not be stored to disk." << endl;
                args.dryrun=true;
            }
            timingsFilename=filename + "_Timings";
            jpolFilename=filename + "_JPol";
            if(!args.dryrun)
            {
                of_jpol.open(jpolFilename.c_str());
                if(!of_jpol)
                    throw("Could not open jpol file");
            }
            if(args.verbose >= 0)
                cout << "Computing " << ss.str() << endl;
        }
    }
}